

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

StatsByIP * __thiscall StatsByIP::CreateCopy(StatsByIP *this)

{
  ulong uVar1;
  StatsByIP *pSVar2;
  size_t __n;
  
  pSVar2 = (StatsByIP *)operator_new(0x58);
  uVar1 = this->addr_len;
  pSVar2->_vptr_StatsByIP = (_func_int **)&PTR__StatsByIP_001e05c0;
  pSVar2->HashNext = (StatsByIP *)0x0;
  pSVar2->count = 1;
  pSVar2->option_mask = 0;
  __n = 0x10;
  if (uVar1 < 0x10) {
    __n = uVar1;
  }
  *(undefined8 *)((long)&pSVar2->nb_not_qname_mini + 2) = 0;
  *(undefined8 *)((long)&pSVar2->nb_tcp_443 + 2) = 0;
  pSVar2->hash = 0;
  pSVar2->nb_do = 0;
  pSVar2->nb_edns = 0;
  pSVar2->nb_not_qname_mini = 0;
  memcpy(pSVar2->addr,this->addr,__n);
  pSVar2->addr_len = __n;
  pSVar2->hash = this->hash;
  pSVar2->nb_do = this->nb_do;
  pSVar2->nb_edns = this->nb_edns;
  pSVar2->nb_not_qname_mini = this->nb_not_qname_mini;
  pSVar2->nb_recursive_queries = this->nb_recursive_queries;
  pSVar2->nb_tcp_443 = this->nb_tcp_443;
  pSVar2->nb_tcp_583 = this->nb_tcp_583;
  pSVar2->query_seen = this->query_seen;
  pSVar2->response_seen = this->response_seen;
  pSVar2->option_mask = this->option_mask;
  return pSVar2;
}

Assistant:

StatsByIP * StatsByIP::CreateCopy()
{
    StatsByIP * x = new StatsByIP(addr, addr_len, false, false, false, false);

    if (x != NULL)
    {
        x->hash = hash;
        x->nb_do = nb_do;
        x->nb_edns = nb_edns;
        x->nb_not_qname_mini = nb_not_qname_mini;
        x->nb_recursive_queries = nb_recursive_queries;
        x->nb_tcp_443 = nb_tcp_443;
        x->nb_tcp_583 = nb_tcp_583;
        x->query_seen = query_seen;
        x->response_seen = response_seen;
        x->option_mask = option_mask;
    }

    return x;
}